

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkCollectCiNames(Abc_Ntk_t *pNtk)

{
  long lVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pVVar4 = pNtk->vCis;
  if (0 < pVVar4->nSize) {
    uVar8 = 100;
    lVar6 = 0;
    do {
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar4->pArray[lVar6]);
      pcVar5 = Extra_UtilStrsav(pcVar5);
      iVar7 = (int)uVar8;
      if ((int)lVar6 == iVar7) {
        if (iVar7 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = 0x10;
          uVar8 = 0x10;
        }
        else {
          uVar8 = (ulong)(uint)(iVar7 * 2);
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(uVar8 * 8);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,uVar8 * 8);
          }
          pVVar2->pArray = ppvVar3;
          pVVar2->nCap = iVar7 * 2;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      lVar1 = lVar6 + 1;
      pVVar2->nSize = (int)lVar1;
      ppvVar3[lVar6] = pcVar5;
      pVVar4 = pNtk->vCis;
      lVar6 = lVar1;
    } while (lVar1 < pVVar4->nSize);
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectCiNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_Ptr_t * vNames;
    vNames = Vec_PtrAlloc( 100 );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_PtrPush( vNames, Extra_UtilStrsav(Abc_ObjName(pObj)) );
    return vNames;
}